

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxread.c
# Opt level: O3

WebPMuxError WebPMuxNumChunks(WebPMux *mux,WebPChunkId id,int *num_elements)

{
  WebPMuxError WVar1;
  int iVar2;
  WebPChunk **ppWVar3;
  ulong uVar4;
  ulong uVar5;
  WebPChunk *pWVar6;
  WebPChunkId *pWVar7;
  WebPChunkId WVar8;
  
  WVar1 = WEBP_MUX_INVALID_ARGUMENT;
  if (num_elements != (int *)0x0 && mux != (WebPMux *)0x0) {
    if ((id < WEBP_CHUNK_EXIF) && ((0x68U >> (id & 0x1f) & 1) != 0)) {
      iVar2 = MuxImageCount(mux->images_,id);
    }
    else {
      ppWVar3 = MuxGetChunkListFromId(mux,id);
      WVar8 = WEBP_CHUNK_VP8X;
      uVar4 = 10;
      pWVar7 = &kChunks[1].id;
      uVar5 = 0;
      do {
        if (WVar8 == id) {
          uVar4 = uVar5 & 0xffffffff;
          break;
        }
        uVar5 = uVar5 + 1;
        WVar8 = *pWVar7;
        pWVar7 = pWVar7 + 3;
      } while (WVar8 != WEBP_CHUNK_NIL);
      pWVar6 = *ppWVar3;
      if (pWVar6 == (WebPChunk *)0x0) {
        iVar2 = 0;
      }
      else {
        iVar2 = 0;
        do {
          if ((kChunks[uVar4].tag == 0) || (pWVar6->tag_ == kChunks[uVar4].tag)) {
            iVar2 = iVar2 + 1;
          }
          pWVar6 = pWVar6->next_;
        } while (pWVar6 != (WebPChunk *)0x0);
      }
    }
    *num_elements = iVar2;
    WVar1 = WEBP_MUX_OK;
  }
  return WVar1;
}

Assistant:

WebPMuxError WebPMuxNumChunks(const WebPMux* mux,
                              WebPChunkId id, int* num_elements) {
  if (mux == NULL || num_elements == NULL) {
    return WEBP_MUX_INVALID_ARGUMENT;
  }

  if (IsWPI(id)) {
    *num_elements = MuxImageCount(mux->images_, id);
  } else {
    WebPChunk* const* chunk_list = MuxGetChunkListFromId(mux, id);
    const CHUNK_INDEX idx = ChunkGetIndexFromId(id);
    *num_elements = CountChunks(*chunk_list, kChunks[idx].tag);
  }

  return WEBP_MUX_OK;
}